

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

bool __thiscall UniqueCheck::operator()(UniqueCheck *this)

{
  long lVar1;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  Mutex *in_stack_ffffffffffffffa8;
  unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffe8,in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
  std::
  unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::insert(in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()()
    {
        LOCK(m);
        results.insert(check_id);
        return true;
    }